

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subcommands.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  App *pAVar2;
  Option *pOVar3;
  ostream *poVar4;
  size_t sVar5;
  void *pvVar6;
  reference ppAVar7;
  string local_4a0;
  App *local_480;
  App *subcom;
  iterator __end1;
  iterator __begin1;
  vector<CLI::App_*,_std::allocator<CLI::App_*>_> *__range1;
  string local_440;
  allocator local_419;
  string local_418;
  undefined4 local_3f4;
  ParseError *e;
  string local_3e0;
  allocator local_3b9;
  string local_3b8;
  Option *local_398;
  Option *s;
  string local_388;
  allocator local_361;
  string local_360;
  undefined1 local_340 [8];
  string file;
  string local_318;
  allocator local_2f1;
  string local_2f0;
  App *local_2d0;
  App *stop;
  string local_2c0;
  allocator local_299;
  string local_298;
  App *local_278;
  App *start;
  string local_268;
  allocator local_241;
  string local_240;
  allocator local_209;
  string local_208;
  undefined1 local_1e8 [8];
  App app;
  char **argv_local;
  int argc_local;
  
  app.config_ptr_ = (Option *)argv;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_208,"K3Pi goofit fitter",&local_209);
  CLI::App::App((App *)local_1e8,&local_208);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator((allocator<char> *)&local_209);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_240,"--random",&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_268,"Some random flag",(allocator *)((long)&start + 7));
  CLI::App::add_flag((App *)local_1e8,&local_240,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator((allocator<char> *)((long)&start + 7));
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator((allocator<char> *)&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_298,"start",&local_299);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c0,"A great subcommand",(allocator *)((long)&stop + 7));
  pAVar2 = CLI::App::add_subcommand((App *)local_1e8,&local_298,&local_2c0);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&stop + 7));
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator((allocator<char> *)&local_299);
  local_278 = pAVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_2f0,"stop",&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_318,"Do you really want to stop?",
             (allocator *)(file.field_2._M_local_buf + 0xf));
  pAVar2 = CLI::App::add_subcommand((App *)local_1e8,&local_2f0,&local_318);
  std::__cxx11::string::~string((string *)&local_318);
  std::allocator<char>::~allocator((allocator<char> *)(file.field_2._M_local_buf + 0xf));
  std::__cxx11::string::~string((string *)&local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  local_2d0 = pAVar2;
  std::__cxx11::string::string((string *)local_340);
  pAVar2 = local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_360,"-f,--file",&local_361);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_388,"File name",(allocator *)((long)&s + 7));
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (pAVar2,&local_360,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340,
             &local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)&local_361);
  pAVar2 = local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3b8,"-c,--count",&local_3b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_3e0,"Counter",(allocator *)((long)&e + 7));
  pOVar3 = CLI::App::add_flag(pAVar2,&local_3b8,&local_3e0);
  std::__cxx11::string::~string((string *)&local_3e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string((string *)&local_3b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
  local_398 = pOVar3;
  CLI::App::parse((App *)local_1e8,argc,(char **)app.config_ptr_);
  poVar4 = std::operator<<((ostream *)&std::cout,"Working on file: ");
  poVar4 = std::operator<<(poVar4,(string *)local_340);
  poVar4 = std::operator<<(poVar4,", direct count: ");
  pAVar2 = local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_418,"--file",&local_419);
  sVar5 = CLI::App::count(pAVar2,&local_418);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_418);
  std::allocator<char>::~allocator((allocator<char> *)&local_419);
  poVar4 = std::operator<<((ostream *)&std::cout,"Working on count: ");
  sVar5 = CLI::Option::count(local_398);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar5);
  poVar4 = std::operator<<(poVar4,", direct count: ");
  pAVar2 = local_2d0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_440,"--count",(allocator *)((long)&__range1 + 7));
  sVar5 = CLI::App::count(pAVar2,&local_440);
  pvVar6 = (void *)std::ostream::operator<<(poVar4,sVar5);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_440);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
  CLI::App::get_subcommands
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin1,(App *)local_1e8,true);
  __end1 = CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::begin
                     ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin1);
  subcom = (App *)CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::end
                            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
                                *)&subcom);
    if (!bVar1) break;
    ppAVar7 = __gnu_cxx::
              __normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
              ::operator*(&__end1);
    local_480 = *ppAVar7;
    poVar4 = std::operator<<((ostream *)&std::cout,"Subcommand:");
    CLI::App::get_name_abi_cxx11_(&local_4a0,local_480);
    poVar4 = std::operator<<(poVar4,(string *)&local_4a0);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_4a0);
    __gnu_cxx::__normal_iterator<CLI::App_**,_std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>_>
    ::operator++(&__end1);
  }
  local_3f4 = 2;
  CLI::std::vector<CLI::App_*,_std::allocator<CLI::App_*>_>::~vector
            ((vector<CLI::App_*,_std::allocator<CLI::App_*>_> *)&__begin1);
  local_3f4 = 1;
  std::__cxx11::string::~string((string *)local_340);
  CLI::App::~App((App *)local_1e8);
  return 0;
}

Assistant:

int main(int argc, char **argv) {

    CLI::App app("K3Pi goofit fitter");
    app.add_flag("--random", "Some random flag");
    CLI::App *start = app.add_subcommand("start", "A great subcommand");
    CLI::App *stop = app.add_subcommand("stop", "Do you really want to stop?");

    std::string file;
    start->add_option("-f,--file", file, "File name");

    CLI::Option *s = stop->add_flag("-c,--count", "Counter");

    CLI11_PARSE(app, argc, argv);

    std::cout << "Working on file: " << file << ", direct count: " << start->count("--file") << std::endl;
    std::cout << "Working on count: " << s->count() << ", direct count: " << stop->count("--count") << std::endl;
    for(auto subcom : app.get_subcommands())
        std::cout << "Subcommand:" << subcom->get_name() << std::endl;

    return 0;
}